

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsResub.c
# Opt level: O0

void Abc_NtkMfsPrintResubStats(Mfs_Man_t *p)

{
  int iVar1;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pObj_00;
  int nFaninMax;
  int nAreaExpanse;
  int nAreaCrits;
  int k;
  int i;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pFanin;
  Mfs_Man_t *p_local;
  
  Abc_NtkGetFaninMax(p->pNtk);
  for (nAreaCrits = 0; iVar1 = Vec_PtrSize(p->pNtk->vObjs), nAreaCrits < iVar1;
      nAreaCrits = nAreaCrits + 1) {
    pObj = Abc_NtkObj(p->pNtk,nAreaCrits);
    if ((pObj != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj), iVar1 != 0)) {
      for (nAreaExpanse = 0; iVar1 = Abc_ObjFaninNum(pObj), nAreaExpanse < iVar1;
          nAreaExpanse = nAreaExpanse + 1) {
        pObj_00 = Abc_ObjFanin(pObj,nAreaExpanse);
        iVar1 = Abc_ObjIsCi(pObj_00);
        if ((iVar1 == 0) && (iVar1 = Abc_ObjFanoutNum(pObj_00), iVar1 == 1)) {
          Abc_ObjFaninNum(pObj);
        }
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkMfsPrintResubStats( Mfs_Man_t * p )
{
    Abc_Obj_t * pFanin, * pNode;
    int i, k, nAreaCrits = 0, nAreaExpanse = 0;
    int nFaninMax = Abc_NtkGetFaninMax(p->pNtk);
    Abc_NtkForEachNode( p->pNtk, pNode, i )
        Abc_ObjForEachFanin( pNode, pFanin, k )
        {
            if ( !Abc_ObjIsCi(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
            {
                nAreaCrits++;
                nAreaExpanse += (int)(Abc_ObjFaninNum(pNode) < nFaninMax);
            }
        }
//    printf( "Total area-critical fanins = %d. Belonging to expandable nodes = %d.\n", 
//        nAreaCrits, nAreaExpanse );
}